

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_v4l2.h
# Opt level: O0

vector<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_> *
util_v4l2::query_formats
          (vector<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_> *__return_storage_ptr__,int fd,
          error_code *err)

{
  int iVar1;
  size_type sVar2;
  undefined1 local_64 [8];
  v4l2_fmtdesc fmt;
  error_code *err_local;
  int fd_local;
  vector<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_> *formats;
  
  if (err != (error_code *)0x0) {
    *err = ERR_NO_ERROR;
  }
  fmt.reserved[1]._3_1_ = 0;
  unique0x10000096 = err;
  std::vector<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>::vector(__return_storage_ptr__);
  local_64._0_4_ = 0;
  local_64._4_4_ = 1;
  while (iVar1 = xioctl(fd,-0x3fbfa9fe,local_64), iVar1 != -1) {
    std::vector<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>::push_back
              (__return_storage_ptr__,(value_type *)local_64);
    local_64._0_4_ = local_64._0_4_ + 1;
  }
  sVar2 = std::vector<v4l2_fmtdesc,_std::allocator<v4l2_fmtdesc>_>::size(__return_storage_ptr__);
  if ((sVar2 == 0) && (stack0xffffffffffffffe0 != (error_code *)0x0)) {
    *stack0xffffffffffffffe0 = ERR_QUERYING_FORMAT;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<v4l2_fmtdesc> query_formats(int fd, error_code *err) {
        SET_ERR_CODE(err, error_code::ERR_NO_ERROR);

        std::vector<v4l2_fmtdesc> formats;
        struct v4l2_fmtdesc fmt;
        fmt.index = 0;
        fmt.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;

        while (-1 != util_v4l2::xioctl(fd, VIDIOC_ENUM_FMT, &fmt)) {
            formats.push_back(fmt);
            fmt.index++;
        }
        if (formats.size() == 0) {
            SET_ERR_CODE(err, error_code::ERR_QUERYING_FORMAT);
        }
        return formats;
    }